

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_engine_base.cpp
# Opt level: O1

void __thiscall zmq::stream_engine_base_t::~stream_engine_base_t(stream_engine_base_t *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  metadata_t *pmVar2;
  pointer pcVar3;
  bool bVar4;
  int iVar5;
  int *piVar6;
  char *pcVar7;
  int in_ESI;
  
  (this->super_io_object_t).super_i_poll_events._vptr_i_poll_events =
       (_func_int **)&PTR__stream_engine_base_t_00269688;
  (this->super_i_engine)._vptr_i_engine = (_func_int **)&PTR__stream_engine_base_t_00269748;
  if (this->_plugged == true) {
    in_ESI = 0x20aad3;
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","!_plugged",
            "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/stream_engine_base.cpp"
            ,0x90);
    fflush(_stderr);
    zmq_abort("!_plugged");
  }
  if (this->_s != -1) {
    iVar5 = close(this->_s);
    if (iVar5 != 0) {
      piVar6 = __errno_location();
      pcVar7 = strerror(*piVar6);
      in_ESI = 0x20aae5;
      fprintf(_stderr,"%s (%s:%d)\n",pcVar7,
              "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/stream_engine_base.cpp"
              ,0x9e);
      fflush(_stderr);
      zmq_abort(pcVar7);
    }
    this->_s = -1;
  }
  iVar5 = msg_t::close(&this->_tx_msg,in_ESI);
  if (iVar5 != 0) {
    piVar6 = __errno_location();
    pcVar7 = strerror(*piVar6);
    fprintf(_stderr,"%s (%s:%d)\n",pcVar7,
            "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/stream_engine_base.cpp"
            ,0xa4);
    fflush(_stderr);
    zmq_abort(pcVar7);
  }
  if (this->_metadata != (metadata_t *)0x0) {
    bVar4 = metadata_t::drop_ref(this->_metadata);
    if (bVar4) {
      pmVar2 = this->_metadata;
      if (pmVar2 != (metadata_t *)0x0) {
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~_Rb_tree(&(pmVar2->_dict)._M_t);
        operator_delete(pmVar2,0x38);
      }
      this->_metadata = (metadata_t *)0x0;
    }
  }
  if (this->_encoder != (i_encoder *)0x0) {
    (*this->_encoder->_vptr_i_encoder[1])();
  }
  this->_encoder = (i_encoder *)0x0;
  if (this->_decoder != (i_decoder *)0x0) {
    (*this->_decoder->_vptr_i_decoder[1])();
  }
  this->_decoder = (i_decoder *)0x0;
  if (this->_mechanism != (mechanism_t *)0x0) {
    (*this->_mechanism->_vptr_mechanism_t[1])();
  }
  this->_mechanism = (mechanism_t *)0x0;
  pcVar3 = (this->_peer_address)._M_dataplus._M_p;
  paVar1 = &(this->_peer_address).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar1) {
    operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
  }
  pcVar3 = (this->_endpoint_uri_pair).remote._M_dataplus._M_p;
  paVar1 = &(this->_endpoint_uri_pair).remote.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar1) {
    operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
  }
  pcVar3 = (this->_endpoint_uri_pair).local._M_dataplus._M_p;
  paVar1 = &(this->_endpoint_uri_pair).local.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar1) {
    operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
  }
  options_t::~options_t(&this->_options);
  io_object_t::~io_object_t(&this->super_io_object_t);
  return;
}

Assistant:

zmq::stream_engine_base_t::~stream_engine_base_t ()
{
    zmq_assert (!_plugged);

    if (_s != retired_fd) {
#ifdef ZMQ_HAVE_WINDOWS
        const int rc = closesocket (_s);
        wsa_assert (rc != SOCKET_ERROR);
#else
        int rc = close (_s);
#if defined(__FreeBSD_kernel__) || defined(__FreeBSD__)
        // FreeBSD may return ECONNRESET on close() under load but this is not
        // an error.
        if (rc == -1 && errno == ECONNRESET)
            rc = 0;
#endif
        errno_assert (rc == 0);
#endif
        _s = retired_fd;
    }

    const int rc = _tx_msg.close ();
    errno_assert (rc == 0);

    //  Drop reference to metadata and destroy it if we are
    //  the only user.
    if (_metadata != NULL) {
        if (_metadata->drop_ref ()) {
            LIBZMQ_DELETE (_metadata);
        }
    }

    LIBZMQ_DELETE (_encoder);
    LIBZMQ_DELETE (_decoder);
    LIBZMQ_DELETE (_mechanism);
}